

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool ok(HighsIndexCollection *index_collection)

{
  bool bVar1;
  uint uVar2;
  vector<int,_std::allocator<int>_> *this;
  const_reference pvVar3;
  uint *puVar4;
  int *in_RDI;
  HighsInt k;
  HighsInt prev_set_entry;
  HighsInt entry_upper;
  HighsInt num_entries;
  vector<int,_std::allocator<int>_> *set;
  uint local_28;
  uint local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    if ((*(byte *)(in_RDI + 4) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0xc) & 1) == 0) {
        printf("Undefined index collection\n");
        return false;
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (bVar1) {
        printf("Index mask is NULL\n");
        return false;
      }
      if ((*(byte *)(in_RDI + 1) & 1) != 0) {
        printf("Index collection is both mask and interval\n");
        return false;
      }
      if ((*(byte *)(in_RDI + 4) & 1) != 0) {
        printf("Index collection is both mask and set\n");
        return false;
      }
    }
    else {
      if ((*(byte *)(in_RDI + 1) & 1) != 0) {
        printf("Index collection is both set and interval\n");
        return false;
      }
      if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
        printf("Index collection is both set and mask\n");
        return false;
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (bVar1) {
        printf("Index set is NULL\n");
        return false;
      }
      this = (vector<int,_std::allocator<int>_> *)(in_RDI + 6);
      iVar5 = in_RDI[5];
      uVar2 = *in_RDI - 1;
      local_24 = 0xffffffff;
      for (local_28 = 0; (int)local_28 < iVar5; local_28 = local_28 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)(int)local_28);
        if ((*pvVar3 < 0) ||
           (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)(int)local_28),
           (int)uVar2 < *pvVar3)) {
          puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (this,(long)(int)local_28);
          printf("Index set entry set[%d] = %d is out of bounds [0, %d]\n",(ulong)local_28,
                 (ulong)*puVar4,(ulong)uVar2);
          return false;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)(int)local_28);
        if (*pvVar3 <= (int)local_24) {
          puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (this,(long)(int)local_28);
          printf("Index set entry set[%d] = %d is not greater than previous entry %d\n",
                 (ulong)local_28,(ulong)*puVar4,(ulong)local_24);
          return false;
        }
        puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (this,(long)(int)local_28);
        local_24 = *puVar4;
      }
    }
  }
  else {
    if ((*(byte *)(in_RDI + 4) & 1) != 0) {
      printf("Index collection is both interval and set\n");
      return false;
    }
    if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
      printf("Index collection is both interval and mask\n");
      return false;
    }
    if (in_RDI[2] < 0) {
      printf("Index interval lower limit is %d < 0\n",(ulong)(uint)in_RDI[2]);
      return false;
    }
    if (*in_RDI + -1 < in_RDI[3]) {
      printf("Index interval upper limit is %d > %d\n",(ulong)(uint)in_RDI[3],(ulong)(*in_RDI - 1));
      return false;
    }
  }
  return true;
}

Assistant:

bool ok(const HighsIndexCollection& index_collection) {
  // Check parameter for each technique of defining an index collection
  if (index_collection.is_interval_) {
    // Changing by interval: check the parameters and that check set and mask
    // are false
    if (index_collection.is_set_) {
      printf("Index collection is both interval and set\n");
      return false;
    }
    if (index_collection.is_mask_) {
      printf("Index collection is both interval and mask\n");
      return false;
    }
    if (index_collection.from_ < 0) {
      printf("Index interval lower limit is %" HIGHSINT_FORMAT " < 0\n",
             index_collection.from_);
      return false;
    }
    if (index_collection.to_ > index_collection.dimension_ - 1) {
      printf("Index interval upper limit is %" HIGHSINT_FORMAT
             " > %" HIGHSINT_FORMAT "\n",
             index_collection.to_, index_collection.dimension_ - 1);
      return false;
    }
  } else if (index_collection.is_set_) {
    // Changing by set: check the parameters and check that interval and mask
    // are false
    if (index_collection.is_interval_) {
      printf("Index collection is both set and interval\n");
      return false;
    }
    if (index_collection.is_mask_) {
      printf("Index collection is both set and mask\n");
      return false;
    }
    if (index_collection.set_.empty()) {
      printf("Index set is NULL\n");
      return false;
    }
    // Check that the values in the vector of integers are ascending
    const vector<HighsInt>& set = index_collection.set_;
    const HighsInt num_entries = index_collection.set_num_entries_;
    const HighsInt entry_upper = index_collection.dimension_ - 1;
    HighsInt prev_set_entry = -1;
    for (HighsInt k = 0; k < num_entries; k++) {
      if (set[k] < 0 || set[k] > entry_upper) {
        printf("Index set entry set[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
               " is out of bounds [0, %" HIGHSINT_FORMAT "]\n",
               k, set[k], entry_upper);
        return false;
      }
      if (set[k] <= prev_set_entry) {
        printf("Index set entry set[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
               " is not greater than "
               "previous entry %" HIGHSINT_FORMAT "\n",
               k, set[k], prev_set_entry);
        return false;
      }
      prev_set_entry = set[k];
    }
    // This was the old check done independently, and should be
    // equivalent.
    assert(increasingSetOk(set, 0, entry_upper, true));
  } else if (index_collection.is_mask_) {
    // Changing by mask: check the parameters and check that set and interval
    // are false
    if (index_collection.mask_.empty()) {
      printf("Index mask is NULL\n");
      return false;
    }
    if (index_collection.is_interval_) {
      printf("Index collection is both mask and interval\n");
      return false;
    }
    if (index_collection.is_set_) {
      printf("Index collection is both mask and set\n");
      return false;
    }
  } else {
    // No method defined
    printf("Undefined index collection\n");
    return false;
  }
  return true;
}